

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.h
# Opt level: O3

void __thiscall CheckStructure::CheckStructure(CheckStructure *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_119;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  string *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_f8 = &(this->m_sMainType).field_2;
  (this->m_sMainType)._M_dataplus._M_p = (pointer)local_f8;
  (this->m_sMainType)._M_string_length = 0;
  (this->m_sMainType).field_2._M_local_buf[0] = '\0';
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_coutTypes = 0;
  this->m_countCalls = 0;
  this->m_fWrongType = false;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"double","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"int","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"void","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"string","");
  local_100 = &this->types;
  __l._M_len = 4;
  __l._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_100,__l,&local_119);
  lVar2 = 0;
  do {
    if (local_80 + lVar2 != *(undefined1 **)((long)local_90 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_90 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x80);
  paVar1 = &(this->nMain).field_2;
  (this->nMain)._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->nMain,"main","");
  local_118 = &(this->nReturn).field_2;
  (this->nReturn)._M_dataplus._M_p = (pointer)local_118;
  local_110 = paVar1;
  local_108 = &this->nMain;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->nReturn,"return","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"(","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,")","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"{","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,";","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"}","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"()","");
  __l_00._M_len = 6;
  __l_00._M_array = &local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->delimiters,__l_00,&local_119);
  lVar2 = 0;
  do {
    if (local_40 + lVar2 != *(undefined1 **)((long)local_50 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0xc0);
  return;
}

Assistant:

CheckStructure() : m_coutTypes(0), m_countCalls(0){}